

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_ideal_endpoints_and_weights.cpp
# Opt level: O0

void compute_ideal_colors_and_weights_1plane
               (image_block *blk,partition_info *pi,endpoints_and_weights *ei)

{
  bool bVar1;
  image_block *in_RDX;
  bool uses_alpha;
  endpoints_and_weights *in_stack_00000258;
  partition_info *in_stack_00000260;
  image_block *in_stack_00000268;
  uint in_stack_00000344;
  endpoints_and_weights *in_stack_00000348;
  partition_info *in_stack_00000350;
  image_block *in_stack_00000358;
  int in_stack_ffffffffffffffe4;
  
  bVar1 = image_block::is_constant_channel(in_RDX,in_stack_ffffffffffffffe4);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    compute_ideal_colors_and_weights_3_comp
              (in_stack_00000358,in_stack_00000350,in_stack_00000348,in_stack_00000344);
  }
  else {
    compute_ideal_colors_and_weights_4_comp(in_stack_00000268,in_stack_00000260,in_stack_00000258);
  }
  return;
}

Assistant:

void compute_ideal_colors_and_weights_1plane(
	const image_block& blk,
	const partition_info& pi,
	endpoints_and_weights& ei
) {
	bool uses_alpha = !blk.is_constant_channel(3);

	if (uses_alpha)
	{
		compute_ideal_colors_and_weights_4_comp(blk, pi, ei);
	}
	else
	{
		compute_ideal_colors_and_weights_3_comp(blk, pi, ei, 3);
	}
}